

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

ServicePublicationPtr __thiscall
miniros::ServiceManager::lookupServicePublication(ServiceManager *this,string *service)

{
  bool bVar1;
  __type_conflict _Var2;
  element_type *this_00;
  string *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  ServicePublicationPtr SVar3;
  shared_ptr<miniros::ServicePublication> *pub;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
  *__range1;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  scoped_lock<std::mutex> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _Self local_38;
  _Self local_30 [6];
  
  std::scoped_lock<std::mutex>::scoped_lock(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_30[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
       ::begin((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                *)in_stack_ffffffffffffff88);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
       ::end((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
              *)in_stack_ffffffffffffff88);
  do {
    bVar1 = std::operator!=(local_30,&local_38);
    if (!bVar1) {
      std::shared_ptr<miniros::ServicePublication>::shared_ptr
                ((shared_ptr<miniros::ServicePublication> *)0x4aedb3);
LAB_004aedbb:
      std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4aedc5);
      SVar3.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      SVar3.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (ServicePublicationPtr)
             SVar3.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
              ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4aed32);
    this_00 = std::
              __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4aed41);
    this_01 = ServicePublication::getName_abi_cxx11_(this_00);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RSI);
    if (_Var2) {
      std::shared_ptr<miniros::ServicePublication>::shared_ptr
                ((shared_ptr<miniros::ServicePublication> *)this_01,
                 (shared_ptr<miniros::ServicePublication> *)in_stack_ffffffffffffff88);
      goto LAB_004aedbb;
    }
    std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator++(local_30);
  } while( true );
}

Assistant:

ServicePublicationPtr ServiceManager::lookupServicePublication(const std::string& service)
{
  std::scoped_lock<std::mutex> lock(service_publications_mutex_);

  for (const auto& pub: service_publications_)
  {
    if (pub->getName() == service)
      return pub;
  }

  return {};
}